

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

void Wlc_NtkToNdrTest(Wlc_Ntk_t *pNtk)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  bool bVar5;
  uint uVar6;
  Ndr_Data_t *p_00;
  void *__ptr;
  char *pcVar7;
  void *__ptr_00;
  uint *puVar8;
  uint *puVar9;
  FILE *pFVar10;
  int Obj;
  int iVar11;
  int iVar12;
  undefined8 uVar13;
  int Ent_2;
  int iVar14;
  ulong uVar15;
  int Ent;
  int iVar16;
  int iVar17;
  char *__format;
  size_t sVar18;
  undefined8 uVar19;
  uint uVar20;
  uint uVar21;
  int Ent_3;
  int iVar22;
  long lVar23;
  ulong uVar24;
  Ndr_Data_t *p;
  
  p_00 = (Ndr_Data_t *)Wlc_NtkToNdr(pNtk);
  iVar12 = pNtk->iObj;
  __ptr = malloc((long)iVar12 * 8);
  if (1 < (long)iVar12) {
    lVar23 = 1;
    do {
      if (pNtk->nObjsAlloc <= lVar23) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pcVar7 = Wlc_ObjName(pNtk,(int)lVar23);
      *(char **)((long)__ptr + lVar23 * 8) = pcVar7;
      lVar23 = lVar23 + 1;
    } while (lVar23 < pNtk->iObj);
  }
  pFVar10 = _stdout;
  if (_stdout == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",0);
  }
  else {
    puVar8 = p_00->pBody;
    if (1 < (int)*puVar8) {
      iVar12 = 1;
      do {
        puVar4 = p_00->pHead;
        if (puVar4[iVar12] == '\x02') {
          Obj = iVar12 + 1;
          iVar14 = puVar8[iVar12] + iVar12;
          if (Obj < iVar14) {
            iVar22 = 0;
            iVar11 = Obj;
            do {
              bVar1 = puVar4[iVar11];
              if (bVar1 == 3) {
                for (iVar17 = iVar11 + 1; uVar6 = 1, iVar17 < (int)(puVar8[iVar11] + iVar11);
                    iVar17 = iVar17 + uVar6) {
                  bVar2 = puVar4[iVar17];
                  if (bVar2 == 6) {
                    uVar6 = (uint)(puVar8[iVar17] == 4);
                    break;
                  }
                  if (bVar2 == 0) goto LAB_00366c39;
                  uVar6 = 1;
                  if (bVar2 < 4) {
                    uVar6 = puVar8[iVar17];
                  }
                }
                iVar22 = iVar22 + uVar6;
              }
              else if (bVar1 == 0) goto LAB_00366c39;
              uVar6 = 1;
              if (bVar1 < 4) {
                uVar6 = puVar8[iVar11];
              }
              iVar11 = iVar11 + uVar6;
            } while (iVar11 < iVar14);
            sVar18 = (long)iVar22 << 2;
          }
          else {
            sVar18 = 0;
          }
          __ptr_00 = malloc(sVar18);
          lVar23 = -1;
          for (iVar11 = Obj; iVar11 < iVar14; iVar11 = iVar11 + uVar6) {
            bVar1 = puVar4[iVar11];
            if (bVar1 == 7) {
              lVar23 = (long)(int)puVar8[iVar11];
              break;
            }
            if (bVar1 == 0) goto LAB_00366c39;
            uVar6 = 1;
            if (bVar1 < 4) {
              uVar6 = puVar8[iVar11];
            }
          }
          fprintf(pFVar10,"\nmodule %s (\n  ",*(undefined8 *)((long)__ptr + lVar23 * 8));
          puVar8 = p_00->pBody;
          iVar14 = Obj;
          if (Obj < (int)(puVar8[iVar12] + iVar12)) {
            do {
              puVar4 = p_00->pHead;
              if (puVar4[iVar14] == '\x03') {
                iVar22 = iVar14 + 1;
                iVar17 = puVar8[iVar14] + iVar14;
                lVar23 = -1;
                iVar11 = iVar22;
                if (iVar22 < iVar17) {
                  do {
                    bVar1 = puVar4[iVar11];
                    if (bVar1 == 6) {
                      if (puVar8[iVar11] != 3) goto LAB_00365349;
                      break;
                    }
                    if (bVar1 == 0) goto LAB_00366c39;
                    uVar6 = 1;
                    if (bVar1 < 4) {
                      uVar6 = puVar8[iVar11];
                    }
                    iVar11 = iVar11 + uVar6;
                  } while (iVar11 < iVar17);
                  do {
                    if (iVar17 <= iVar22) break;
                    bVar1 = puVar4[iVar22];
                    if (bVar1 == 5) {
                      lVar23 = (long)(int)puVar8[iVar22];
                      break;
                    }
                    if (bVar1 == 0) goto LAB_00366c39;
                    uVar6 = 1;
                    if (bVar1 < 4) {
                      uVar6 = puVar8[iVar22];
                    }
                    iVar22 = iVar22 + uVar6;
                  } while( true );
                }
                fprintf(pFVar10,"%s, ",*(undefined8 *)((long)__ptr + lVar23 * 8));
              }
              else if (puVar4[iVar14] == '\0') goto LAB_00366c39;
LAB_00365349:
              if (p_00->pHead[iVar14] == 0) goto LAB_00366c39;
              uVar6 = 1;
              if (p_00->pHead[iVar14] < 4) {
                uVar6 = p_00->pBody[iVar14];
              }
              iVar14 = iVar14 + uVar6;
              puVar8 = p_00->pBody;
            } while (iVar14 < (int)(puVar8[iVar12] + iVar12));
          }
          fwrite("\n  ",3,1,pFVar10);
          puVar8 = p_00->pBody;
          if (Obj < (int)(puVar8[iVar12] + iVar12)) {
            bVar5 = true;
            iVar14 = Obj;
            do {
              puVar4 = p_00->pHead;
              if (puVar4[iVar14] == '\x03') {
                iVar22 = iVar14 + 1;
                for (iVar11 = iVar22; iVar11 < (int)(puVar8[iVar14] + iVar14);
                    iVar11 = iVar11 + uVar6) {
                  bVar1 = puVar4[iVar11];
                  if (bVar1 == 6) {
                    if (puVar8[iVar11] != 4) goto LAB_00365497;
                    break;
                  }
                  if (bVar1 == 0) goto LAB_00366c39;
                  uVar6 = 1;
                  if (bVar1 < 4) {
                    uVar6 = puVar8[iVar11];
                  }
                }
                pcVar7 = "T = %d\t\t";
                if (!bVar5) {
                  pcVar7 = "    \"%s\", ";
                }
                lVar23 = -1;
                for (; iVar22 < (int)(puVar8[iVar14] + iVar14); iVar22 = iVar22 + uVar6) {
                  bVar1 = puVar4[iVar22];
                  if (bVar1 == 4) {
                    lVar23 = (long)(int)puVar8[iVar22];
                    break;
                  }
                  if (bVar1 == 0) goto LAB_00366c39;
                  uVar6 = 1;
                  if (bVar1 < 4) {
                    uVar6 = puVar8[iVar22];
                  }
                }
                bVar5 = false;
                fprintf(pFVar10,"%s%s",pcVar7 + 8,*(undefined8 *)((long)__ptr + lVar23 * 8));
              }
              else if (puVar4[iVar14] == '\0') goto LAB_00366c39;
LAB_00365497:
              if (p_00->pHead[iVar14] == 0) goto LAB_00366c39;
              uVar6 = 1;
              if (p_00->pHead[iVar14] < 4) {
                uVar6 = p_00->pBody[iVar14];
              }
              iVar14 = iVar14 + uVar6;
              puVar8 = p_00->pBody;
            } while (iVar14 < (int)(puVar8[iVar12] + iVar12));
          }
          fwrite("\n);\n\n",5,1,pFVar10);
          puVar8 = p_00->pBody;
          iVar14 = Obj;
          if (Obj < (int)(puVar8[iVar12] + iVar12)) {
            do {
              uVar3 = p_00->pHead[iVar14];
              if (uVar3 == '\x03') {
                iVar22 = iVar14 + 1;
                for (iVar11 = iVar22; iVar11 < (int)(puVar8[iVar14] + iVar14);
                    iVar11 = iVar11 + uVar6) {
                  bVar1 = p_00->pHead[iVar11];
                  if (bVar1 == 6) {
                    if (puVar8[iVar11] != 3) goto LAB_00365607;
                    break;
                  }
                  if (bVar1 == 0) goto LAB_00366c39;
                  uVar6 = 1;
                  if (bVar1 < 4) {
                    uVar6 = puVar8[iVar11];
                  }
                }
                fwrite("  input ",8,1,pFVar10);
                Ndr_ObjWriteRange(p_00,iVar14,(FILE *)pFVar10,1);
                puVar8 = p_00->pBody;
                lVar23 = -1;
                if (iVar22 < (int)(puVar8[iVar14] + iVar14)) {
                  do {
                    bVar1 = p_00->pHead[iVar22];
                    if (bVar1 == 5) {
                      lVar23 = (long)(int)puVar8[iVar22];
                      break;
                    }
                    if (bVar1 == 0) goto LAB_00366c39;
                    uVar6 = 1;
                    if (bVar1 < 4) {
                      uVar6 = puVar8[iVar22];
                    }
                    iVar22 = iVar22 + uVar6;
                  } while (iVar22 < (int)(puVar8[iVar14] + iVar14));
                }
                fprintf(pFVar10," %s;\n",*(undefined8 *)((long)__ptr + lVar23 * 8));
              }
              else if (uVar3 == '\0') goto LAB_00366c39;
LAB_00365607:
              if (p_00->pHead[iVar14] == 0) goto LAB_00366c39;
              uVar6 = 1;
              if (p_00->pHead[iVar14] < 4) {
                uVar6 = p_00->pBody[iVar14];
              }
              iVar14 = iVar14 + uVar6;
              puVar8 = p_00->pBody;
            } while (iVar14 < (int)(puVar8[iVar12] + iVar12));
          }
          puVar8 = p_00->pBody;
          uVar6 = 0;
          if (Obj < (int)(puVar8[iVar12] + iVar12)) {
            uVar6 = 0;
            iVar14 = Obj;
            do {
              uVar3 = p_00->pHead[iVar14];
              if (uVar3 == '\x03') {
                iVar22 = iVar14 + 1;
                for (iVar11 = iVar22; iVar11 < (int)(puVar8[iVar14] + iVar14);
                    iVar11 = iVar11 + uVar20) {
                  bVar1 = p_00->pHead[iVar11];
                  if (bVar1 == 6) {
                    if (puVar8[iVar11] != 4) goto LAB_003657d9;
                    break;
                  }
                  if (bVar1 == 0) goto LAB_00366c39;
                  uVar20 = 1;
                  if (bVar1 < 4) {
                    uVar20 = puVar8[iVar11];
                  }
                }
                fwrite("  output ",9,1,pFVar10);
                Ndr_ObjWriteRange(p_00,iVar14,(FILE *)pFVar10,1);
                puVar8 = p_00->pBody;
                lVar23 = -1;
                if (iVar22 < (int)(puVar8[iVar14] + iVar14)) {
                  iVar11 = iVar22;
                  do {
                    bVar1 = p_00->pHead[iVar11];
                    if (bVar1 == 4) {
                      lVar23 = (long)(int)puVar8[iVar11];
                      break;
                    }
                    if (bVar1 == 0) goto LAB_00366c39;
                    uVar20 = 1;
                    if (bVar1 < 4) {
                      uVar20 = puVar8[iVar11];
                    }
                    iVar11 = iVar11 + uVar20;
                  } while (iVar11 < (int)(puVar8[iVar14] + iVar14));
                }
                fprintf(pFVar10," %s;\n",*(undefined8 *)((long)__ptr + lVar23 * 8));
                puVar8 = p_00->pBody;
                uVar20 = 0xffffffff;
                if (iVar22 < (int)(puVar8[iVar14] + iVar14)) {
                  do {
                    bVar1 = p_00->pHead[iVar22];
                    if (bVar1 == 4) {
                      uVar20 = puVar8[iVar22];
                      break;
                    }
                    if (bVar1 == 0) goto LAB_00366c39;
                    uVar21 = 1;
                    if (bVar1 < 4) {
                      uVar21 = puVar8[iVar22];
                    }
                    iVar22 = iVar22 + uVar21;
                  } while (iVar22 < (int)(puVar8[iVar14] + iVar14));
                }
                lVar23 = (long)(int)uVar6;
                uVar6 = uVar6 + 1;
                *(uint *)((long)__ptr_00 + lVar23 * 4) = uVar20;
              }
              else if (uVar3 == '\0') goto LAB_00366c39;
LAB_003657d9:
              if (p_00->pHead[iVar14] == 0) goto LAB_00366c39;
              uVar20 = 1;
              if (p_00->pHead[iVar14] < 4) {
                uVar20 = p_00->pBody[iVar14];
              }
              iVar14 = iVar14 + uVar20;
              puVar8 = p_00->pBody;
            } while (iVar14 < (int)(puVar8[iVar12] + iVar12));
          }
          fputc(10,pFVar10);
          puVar8 = p_00->pBody;
          if (Obj < (int)(puVar8[iVar12] + iVar12)) {
            iVar14 = Obj;
LAB_0036583c:
            puVar4 = p_00->pHead;
            if (puVar4[iVar14] == '\x03') {
              iVar22 = puVar8[iVar14] + iVar14;
              iVar17 = iVar14 + 1;
              for (iVar11 = iVar17; iVar11 < iVar22; iVar11 = iVar11 + uVar20) {
                bVar1 = puVar4[iVar11];
                if (bVar1 == 6) {
                  if ((iVar17 < iVar22) && (iVar16 = iVar17, puVar8[iVar11] != 3))
                  goto LAB_003658ba;
                  break;
                }
                if (bVar1 == 0) goto LAB_00366c39;
                uVar20 = 1;
                if (bVar1 < 4) {
                  uVar20 = puVar8[iVar11];
                }
              }
              goto LAB_00365a03;
            }
            if (puVar4[iVar14] == '\0') goto LAB_00366c39;
            goto LAB_00365a03;
          }
LAB_00365a3d:
          free(__ptr_00);
          fputc(10,pFVar10);
          puVar8 = p_00->pBody;
          if (Obj < (int)(puVar8[iVar12] + iVar12)) {
LAB_00365a70:
            puVar4 = p_00->pHead;
            if (puVar4[Obj] == '\x03') {
              iVar11 = puVar8[Obj] + Obj;
              iVar22 = Obj + 1;
              for (iVar14 = iVar22; iVar14 < iVar11; iVar14 = iVar14 + uVar6) {
                bVar1 = puVar4[iVar14];
                if (bVar1 == 6) {
                  if ((iVar22 < iVar11) && (iVar17 = iVar22, puVar8[iVar14] != 3))
                  goto LAB_00365af3;
                  break;
                }
                if (bVar1 == 0) goto LAB_00366c39;
                uVar6 = 1;
                if (bVar1 < 4) {
                  uVar6 = puVar8[iVar14];
                }
              }
              goto LAB_003669d4;
            }
            if (puVar4[Obj] == '\0') goto LAB_00366c39;
            goto LAB_003669d4;
          }
LAB_00366b2c:
          fwrite("\nendmodule\n\n",0xc,1,pFVar10);
        }
        else if (puVar4[iVar12] == '\0') goto LAB_00366c39;
        if (p_00->pHead[iVar12] == 0) {
LAB_00366c39:
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
        uVar6 = 1;
        if (p_00->pHead[iVar12] < 4) {
          uVar6 = p_00->pBody[iVar12];
        }
        iVar12 = iVar12 + uVar6;
        puVar8 = p_00->pBody;
      } while (iVar12 < (int)*puVar8);
    }
  }
  pFVar10 = fopen("test.ndr","wb");
  if (pFVar10 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n","test.ndr");
  }
  else {
    fwrite(p_00->pBody,4,(ulong)*p_00->pBody,pFVar10);
    fwrite(p_00->pHead,1,(ulong)*p_00->pBody,pFVar10);
    fclose(pFVar10);
  }
  if (p_00 != (Ndr_Data_t *)0x0) {
    free(p_00->pHead);
    free(p_00->pBody);
    free(p_00);
  }
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
  while( true ) {
    if (bVar1 == 0) goto LAB_00366c39;
    uVar20 = 1;
    if (bVar1 < 4) {
      uVar20 = puVar8[iVar16];
    }
    iVar16 = iVar16 + uVar20;
    if (iVar22 <= iVar16) break;
LAB_003658ba:
    bVar1 = puVar4[iVar16];
    if (bVar1 == 6) {
      if (puVar8[iVar16] != 4) {
        if ((int)uVar6 < 1) goto LAB_00365961;
        uVar15 = 0;
        goto LAB_00365900;
      }
      break;
    }
  }
  goto LAB_00365a03;
  while (uVar15 = uVar15 + 1, uVar15 != uVar6) {
LAB_00365900:
    uVar20 = 0xffffffff;
    for (iVar11 = iVar17; iVar11 < iVar22; iVar11 = iVar11 + uVar21) {
      bVar1 = puVar4[iVar11];
      if (bVar1 == 5) {
        uVar20 = puVar8[iVar11];
        break;
      }
      if (bVar1 == 0) goto LAB_00366c39;
      uVar21 = 1;
      if (bVar1 < 4) {
        uVar21 = puVar8[iVar11];
      }
    }
    if (*(uint *)((long)__ptr_00 + uVar15 * 4) == uVar20) goto LAB_00365a03;
  }
LAB_00365961:
  fwrite("  wire ",7,1,pFVar10);
  Ndr_ObjWriteRange(p_00,iVar14,(FILE *)pFVar10,1);
  puVar8 = p_00->pBody;
  lVar23 = -1;
  if (iVar17 < (int)(puVar8[iVar14] + iVar14)) {
    do {
      bVar1 = p_00->pHead[iVar17];
      if (bVar1 == 5) {
        lVar23 = (long)(int)puVar8[iVar17];
        break;
      }
      if (bVar1 == 0) goto LAB_00366c39;
      uVar20 = 1;
      if (bVar1 < 4) {
        uVar20 = puVar8[iVar17];
      }
      iVar17 = iVar17 + uVar20;
    } while (iVar17 < (int)(puVar8[iVar14] + iVar14));
  }
  fprintf(pFVar10," %s;\n",*(undefined8 *)((long)__ptr + lVar23 * 8));
LAB_00365a03:
  if (p_00->pHead[iVar14] == 0) goto LAB_00366c39;
  uVar20 = 1;
  if (p_00->pHead[iVar14] < 4) {
    uVar20 = p_00->pBody[iVar14];
  }
  iVar14 = iVar14 + uVar20;
  puVar8 = p_00->pBody;
  if ((int)(puVar8[iVar12] + iVar12) <= iVar14) goto LAB_00365a3d;
  goto LAB_0036583c;
  while( true ) {
    if (bVar1 == 0) goto LAB_00366c39;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar8[iVar17];
    }
    iVar17 = iVar17 + uVar6;
    if (iVar11 <= iVar17) break;
LAB_00365af3:
    bVar1 = puVar4[iVar17];
    if (bVar1 == 6) {
      if (puVar8[iVar17] != 4) {
        uVar6 = 0xffffffff;
        iVar14 = iVar22;
        if (iVar22 < iVar11) goto LAB_00365b3e;
        goto LAB_00365b72;
      }
      break;
    }
  }
  goto LAB_003669d4;
  while( true ) {
    if (bVar1 == 0) goto LAB_00366c39;
    uVar20 = 1;
    if (bVar1 < 4) {
      uVar20 = puVar8[iVar14];
    }
    iVar14 = iVar14 + uVar20;
    if (iVar11 <= iVar14) break;
LAB_00365b3e:
    bVar1 = puVar4[iVar14];
    if (bVar1 == 6) {
      uVar6 = puVar8[iVar14];
      break;
    }
  }
LAB_00365b72:
  if (0xff < (int)uVar6) {
    lVar23 = -1;
    for (iVar14 = uVar6 - 0xff; iVar14 < (int)(uVar6 + puVar8[(long)(int)uVar6 + -0x100] + -0x100);
        iVar14 = iVar14 + uVar20) {
      bVar1 = puVar4[iVar14];
      if (bVar1 == 7) {
        lVar23 = (long)(int)puVar8[iVar14];
        break;
      }
      if (bVar1 == 0) goto LAB_00366c39;
      uVar20 = 1;
      if (bVar1 < 4) {
        uVar20 = puVar8[iVar14];
      }
    }
    fprintf(pFVar10,"  %s ",*(undefined8 *)((long)__ptr + lVar23 * 8));
    puVar8 = p_00->pBody;
    iVar14 = puVar8[Obj] + Obj;
    if (iVar22 < iVar14) {
      iVar11 = iVar22;
      do {
        bVar1 = p_00->pHead[iVar11];
        if (bVar1 == 7) {
          iVar17 = iVar22;
          if (0 < (int)puVar8[iVar11]) goto LAB_00365cde;
          break;
        }
        if (bVar1 == 0) goto LAB_00366c39;
        uVar6 = 1;
        if (bVar1 < 4) {
          uVar6 = puVar8[iVar11];
        }
        iVar11 = iVar11 + uVar6;
      } while (iVar11 < iVar14);
    }
    goto LAB_00365ec7;
  }
  switch(uVar6) {
  case 0x50:
    fprintf(pFVar10,"  %s ","ABC_READ");
    puVar8 = p_00->pBody;
    iVar14 = puVar8[Obj] + Obj;
    if (iVar22 < iVar14) {
      iVar11 = iVar22;
      do {
        bVar1 = p_00->pHead[iVar11];
        if (bVar1 == 7) {
          iVar17 = iVar22;
          if (0 < (int)puVar8[iVar11]) goto LAB_0036603d;
          break;
        }
        if (bVar1 == 0) goto LAB_00366c39;
        uVar6 = 1;
        if (bVar1 < 4) {
          uVar6 = puVar8[iVar11];
        }
        iVar11 = iVar11 + uVar6;
      } while (iVar11 < iVar14);
    }
    goto LAB_003665b0;
  case 0x51:
    fprintf(pFVar10,"  %s ","ABC_WRITE");
    puVar8 = p_00->pBody;
    iVar14 = puVar8[Obj] + Obj;
    if (iVar22 < iVar14) {
      iVar11 = iVar22;
      do {
        bVar1 = p_00->pHead[iVar11];
        if (bVar1 == 7) {
          iVar17 = iVar22;
          if (0 < (int)puVar8[iVar11]) goto LAB_00366088;
          break;
        }
        if (bVar1 == 0) goto LAB_00366c39;
        uVar6 = 1;
        if (bVar1 < 4) {
          uVar6 = puVar8[iVar11];
        }
        iVar11 = iVar11 + uVar6;
      } while (iVar11 < iVar14);
    }
    goto LAB_003666d5;
  case 0x58:
    fprintf(pFVar10,"  %s ","ABC_DFF");
    puVar8 = p_00->pBody;
    iVar14 = puVar8[Obj] + Obj;
    if (iVar22 < iVar14) {
      iVar11 = iVar22;
      do {
        bVar1 = p_00->pHead[iVar11];
        if (bVar1 == 7) {
          iVar17 = iVar22;
          if (0 < (int)puVar8[iVar11]) goto LAB_00365ff2;
          break;
        }
        if (bVar1 == 0) goto LAB_00366c39;
        uVar6 = 1;
        if (bVar1 < 4) {
          uVar6 = puVar8[iVar11];
        }
        iVar11 = iVar11 + uVar6;
      } while (iVar11 < iVar14);
    }
    goto LAB_0036649c;
  case 0x59:
    fprintf(pFVar10,"  %s ","ABC_DFFRSE");
    puVar8 = p_00->pBody;
    iVar14 = puVar8[Obj] + Obj;
    if (iVar22 < iVar14) {
      iVar11 = iVar22;
      do {
        bVar1 = p_00->pHead[iVar11];
        if (bVar1 == 7) {
          iVar17 = iVar22;
          if (0 < (int)puVar8[iVar11]) goto LAB_003660d3;
          break;
        }
        if (bVar1 == 0) goto LAB_00366c39;
        uVar6 = 1;
        if (bVar1 < 4) {
          uVar6 = puVar8[iVar11];
        }
        iVar11 = iVar11 + uVar6;
      } while (iVar11 < iVar14);
    }
    goto LAB_00366813;
  }
  lVar23 = -1;
  for (iVar14 = iVar22; iVar14 < iVar11; iVar14 = iVar14 + uVar20) {
    bVar1 = puVar4[iVar14];
    if (bVar1 == 5) {
      lVar23 = (long)(int)puVar8[iVar14];
      break;
    }
    if (bVar1 == 0) goto LAB_00366c39;
    uVar20 = 1;
    if (bVar1 < 4) {
      uVar20 = puVar8[iVar14];
    }
  }
  fprintf(pFVar10,"  assign %s = ",*(undefined8 *)((long)__ptr + lVar23 * 8));
  puVar8 = p_00->pBody;
  iVar14 = puVar8[Obj] + Obj;
  if (iVar22 < iVar14) {
    puVar9 = (uint *)0x0;
    uVar15 = 0;
    iVar11 = iVar22;
    do {
      bVar1 = p_00->pHead[iVar11];
      if (bVar1 == 4) {
        uVar15 = (ulong)((int)uVar15 + 1);
        if (puVar9 == (uint *)0x0) {
          puVar9 = puVar8 + iVar11;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_00366c39;
        if (puVar9 != (uint *)0x0) break;
      }
      uVar20 = 1;
      if (bVar1 < 4) {
        uVar20 = puVar8[iVar11];
      }
      iVar11 = iVar11 + uVar20;
    } while (iVar11 < iVar14);
  }
  else {
    puVar9 = (uint *)0x0;
    uVar15 = 0;
  }
  iVar11 = (int)uVar15;
  if (iVar11 == 0) {
    if (iVar22 < iVar14) {
      do {
        bVar1 = p_00->pHead[iVar22];
        if (bVar1 == 9) {
          puVar8 = puVar8 + iVar22;
          goto LAB_003663fc;
        }
        if (bVar1 == 0) goto LAB_00366c39;
        uVar6 = 1;
        if (bVar1 < 4) {
          uVar6 = puVar8[iVar22];
        }
        iVar22 = iVar22 + uVar6;
      } while (iVar22 < iVar14);
      puVar8 = (uint *)0x0;
    }
    else {
      puVar8 = (uint *)0x0;
    }
LAB_003663fc:
    fprintf(pFVar10,"%s;\n",puVar8);
    goto LAB_003669d4;
  }
  if (iVar11 == 1 && iVar22 < iVar14) {
    iVar17 = iVar22;
    do {
      bVar1 = p_00->pHead[iVar17];
      if (bVar1 == 6) {
        if (puVar8[iVar17] == 0xb) {
          puVar8 = *(uint **)((long)__ptr + (long)(int)*puVar9 * 8);
          goto LAB_003663fc;
        }
        break;
      }
      if (bVar1 == 0) goto LAB_00366c39;
      uVar20 = 1;
      if (bVar1 < 4) {
        uVar20 = puVar8[iVar17];
      }
      iVar17 = iVar17 + uVar20;
    } while (iVar17 < iVar14);
  }
  if (uVar6 == 0x5c) {
    fputc(0x7b,pFVar10);
    if (0 < iVar11) {
      uVar24 = 0;
      do {
        pcVar7 = "    \"%s\", ";
        if (iVar11 - 1 == uVar24) {
          pcVar7 = "T = %d\t\t";
        }
        fprintf(pFVar10,"%s%s",*(undefined8 *)((long)__ptr + (long)(int)puVar9[uVar24] * 8),
                pcVar7 + 8);
        uVar24 = uVar24 + 1;
      } while (uVar15 != uVar24);
    }
    fwrite("};\n",3,1,pFVar10);
    goto LAB_003669d4;
  }
  if (uVar6 != 0x5b) {
    if (iVar11 == 1) {
      uVar6 = 0xffffffff;
      if (iVar22 < iVar14) {
        do {
          bVar1 = p_00->pHead[iVar22];
          if (bVar1 == 6) {
            uVar6 = puVar8[iVar22];
            break;
          }
          if (bVar1 == 0) goto LAB_00366c39;
          uVar20 = 1;
          if (bVar1 < 4) {
            uVar20 = puVar8[iVar22];
          }
          iVar22 = iVar22 + uVar20;
        } while (iVar22 < iVar14);
      }
      pcVar7 = Abc_OperName(uVar6);
      fprintf(pFVar10,"%s %s;\n",pcVar7,*(undefined8 *)((long)__ptr + (long)(int)*puVar9 * 8));
    }
    else {
      if (iVar11 == 2) {
        uVar13 = *(undefined8 *)((long)__ptr + (long)(int)*puVar9 * 8);
        iVar14 = Ndr_ObjReadBody(p_00,Obj,6);
        pcVar7 = Abc_OperName(iVar14);
        uVar19 = *(undefined8 *)((long)__ptr + (long)(int)puVar9[1] * 8);
        __format = "%s %s %s;\n";
      }
      else if (uVar6 == 0x32 && iVar11 == 3) {
        uVar13 = *(undefined8 *)((long)__ptr + (long)(int)*puVar9 * 8);
        pcVar7 = *(char **)((long)__ptr + (long)(int)puVar9[1] * 8);
        uVar19 = *(undefined8 *)((long)__ptr + (long)(int)puVar9[2] * 8);
        __format = "%s + %s + %s;\n";
      }
      else {
        if (uVar6 != 0x15) {
          iVar14 = Ndr_ObjReadBody(p_00,Obj,6);
          pcVar7 = Abc_OperName(iVar14);
          fprintf(pFVar10,"<cannot write operation %s>;\n",pcVar7);
          goto LAB_003669d4;
        }
        uVar13 = *(undefined8 *)((long)__ptr + (long)(int)*puVar9 * 8);
        pcVar7 = *(char **)((long)__ptr + (long)(int)puVar9[1] * 8);
        uVar19 = *(undefined8 *)((long)__ptr + (long)(int)puVar9[2] * 8);
        __format = "%s ? %s : %s;\n";
      }
      fprintf(pFVar10,__format,uVar13,pcVar7,uVar19);
    }
    goto LAB_003669d4;
  }
  fputs(*(char **)((long)__ptr + (long)(int)*puVar9 * 8),pFVar10);
  puVar8 = p_00->pBody;
  if (iVar22 < (int)(puVar8[Obj] + Obj)) {
    puVar9 = (uint *)0x0;
    iVar14 = 0;
    do {
      bVar1 = p_00->pHead[iVar22];
      if (bVar1 == 8) {
        iVar14 = iVar14 + 1;
        if (puVar9 == (uint *)0x0) {
          puVar9 = puVar8 + iVar22;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_00366c39;
        if (puVar9 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar22];
      }
      iVar22 = iVar22 + uVar6;
    } while (iVar22 < (int)(puVar8[Obj] + Obj));
  }
  else {
    puVar9 = (uint *)0x0;
    iVar14 = 0;
  }
  if (iVar14 == 0) {
    uVar6 = 0;
LAB_00366a21:
    fprintf(pFVar10,"[%d]",(ulong)uVar6);
  }
  else {
    if (iVar14 == 1) {
      uVar6 = *puVar9;
      goto LAB_00366a21;
    }
    fprintf(pFVar10,"[%d:%d]",(ulong)*puVar9,(ulong)puVar9[1]);
  }
  sVar18 = 2;
  pcVar7 = ";\n";
  goto LAB_003669c7;
  while( true ) {
    if (bVar1 == 0) goto LAB_00366c39;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar8[iVar17];
    }
    iVar17 = iVar17 + uVar6;
    if (iVar14 <= iVar17) break;
LAB_00365cde:
    bVar1 = p_00->pHead[iVar17];
    if (bVar1 == 7) {
      lVar23 = (long)(int)puVar8[iVar17];
      goto LAB_00365eb1;
    }
  }
  lVar23 = -1;
LAB_00365eb1:
  fprintf(pFVar10,"%s ",*(undefined8 *)((long)__ptr + lVar23 * 8));
LAB_00365ec7:
  fwrite("( ",2,1,pFVar10);
  puVar8 = p_00->pBody;
  if (iVar22 < (int)(puVar8[Obj] + Obj)) {
    puVar9 = (uint *)0x0;
    uVar6 = 0;
    do {
      bVar1 = p_00->pHead[iVar22];
      if (bVar1 == 4) {
        uVar6 = uVar6 + 1;
        if (puVar9 == (uint *)0x0) {
          puVar9 = puVar8 + iVar22;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_00366c39;
        if (puVar9 != (uint *)0x0) break;
      }
      uVar20 = 1;
      if (bVar1 < 4) {
        uVar20 = puVar8[iVar22];
      }
      iVar22 = iVar22 + uVar20;
    } while (iVar22 < (int)(puVar8[Obj] + Obj));
  }
  else {
    puVar9 = (uint *)0x0;
    uVar6 = 0;
  }
  if (0 < (int)uVar6) {
    uVar15 = 0;
    do {
      pcVar7 = ",";
      if (uVar6 - 1 == uVar15) {
        pcVar7 = "";
      }
      fprintf(pFVar10,"%s%s ",*(undefined8 *)((long)__ptr + (long)(int)puVar9[uVar15] * 8),pcVar7);
      uVar15 = uVar15 + 1;
    } while (uVar6 != uVar15);
  }
  fwrite(");\n",3,1,pFVar10);
  goto LAB_003669d4;
  while( true ) {
    if (bVar1 == 0) goto LAB_00366c39;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar8[iVar17];
    }
    iVar17 = iVar17 + uVar6;
    if (iVar14 <= iVar17) break;
LAB_003660d3:
    bVar1 = p_00->pHead[iVar17];
    if (bVar1 == 7) {
      lVar23 = (long)(int)puVar8[iVar17];
      goto LAB_003667fd;
    }
  }
  lVar23 = -1;
LAB_003667fd:
  fprintf(pFVar10,"%s ",*(undefined8 *)((long)__ptr + lVar23 * 8));
LAB_00366813:
  fwrite("( ",2,1,pFVar10);
  puVar8 = p_00->pBody;
  iVar14 = puVar8[Obj] + Obj;
  if (iVar22 < iVar14) {
    puVar9 = (uint *)0x0;
    iVar11 = iVar22;
    do {
      bVar1 = p_00->pHead[iVar11];
      if (bVar1 == 4) {
        if (puVar9 == (uint *)0x0) {
          puVar9 = puVar8 + iVar11;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_00366c39;
        if (puVar9 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar11];
      }
      iVar11 = iVar11 + uVar6;
    } while (iVar11 < iVar14);
  }
  else {
    puVar9 = (uint *)0x0;
  }
  lVar23 = -1;
  if (iVar22 < iVar14) {
    do {
      bVar1 = p_00->pHead[iVar22];
      if (bVar1 == 5) {
        lVar23 = (long)(int)puVar8[iVar22];
        break;
      }
      if (bVar1 == 0) goto LAB_00366c39;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar22];
      }
      iVar22 = iVar22 + uVar6;
    } while (iVar22 < iVar14);
  }
  fprintf(pFVar10,".q(%s), ",*(undefined8 *)((long)__ptr + lVar23 * 8));
  fprintf(pFVar10,".d(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar9 * 8));
  fprintf(pFVar10,".clk(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar9[1] * 8));
  fprintf(pFVar10,".reset(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar9[2] * 8));
  fprintf(pFVar10,".set(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar9[3] * 8));
  fprintf(pFVar10,".enable(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar9[4] * 8));
  fprintf(pFVar10,".async(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar9[5] * 8));
  fprintf(pFVar10,".sre(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar9[6] * 8));
  uVar6 = puVar9[7];
  goto LAB_0036699e;
  while( true ) {
    if (bVar1 == 0) goto LAB_00366c39;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar8[iVar17];
    }
    iVar17 = iVar17 + uVar6;
    if (iVar14 <= iVar17) break;
LAB_00365ff2:
    bVar1 = p_00->pHead[iVar17];
    if (bVar1 == 7) {
      lVar23 = (long)(int)puVar8[iVar17];
      goto LAB_00366486;
    }
  }
  lVar23 = -1;
LAB_00366486:
  fprintf(pFVar10,"%s ",*(undefined8 *)((long)__ptr + lVar23 * 8));
LAB_0036649c:
  fwrite("( ",2,1,pFVar10);
  puVar8 = p_00->pBody;
  iVar14 = puVar8[Obj] + Obj;
  if (iVar22 < iVar14) {
    puVar9 = (uint *)0x0;
    iVar11 = iVar22;
    do {
      bVar1 = p_00->pHead[iVar11];
      if (bVar1 == 4) {
        if (puVar9 == (uint *)0x0) {
          puVar9 = puVar8 + iVar11;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_00366c39;
        if (puVar9 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar11];
      }
      iVar11 = iVar11 + uVar6;
    } while (iVar11 < iVar14);
  }
  else {
    puVar9 = (uint *)0x0;
  }
  lVar23 = -1;
  if (iVar22 < iVar14) {
    do {
      bVar1 = p_00->pHead[iVar22];
      if (bVar1 == 5) {
        lVar23 = (long)(int)puVar8[iVar22];
        break;
      }
      if (bVar1 == 0) goto LAB_00366c39;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar22];
      }
      iVar22 = iVar22 + uVar6;
    } while (iVar22 < iVar14);
  }
  fprintf(pFVar10,".q(%s), ",*(undefined8 *)((long)__ptr + lVar23 * 8));
  fprintf(pFVar10,".d(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar9 * 8));
  uVar6 = puVar9[1];
LAB_0036699e:
  uVar13 = *(undefined8 *)((long)__ptr + (long)(int)uVar6 * 8);
  pcVar7 = ".init(%s) ";
  goto LAB_003669af;
  while( true ) {
    if (bVar1 == 0) goto LAB_00366c39;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar8[iVar17];
    }
    iVar17 = iVar17 + uVar6;
    if (iVar14 <= iVar17) break;
LAB_00366088:
    bVar1 = p_00->pHead[iVar17];
    if (bVar1 == 7) {
      lVar23 = (long)(int)puVar8[iVar17];
      goto LAB_003666bf;
    }
  }
  lVar23 = -1;
LAB_003666bf:
  fprintf(pFVar10,"%s ",*(undefined8 *)((long)__ptr + lVar23 * 8));
LAB_003666d5:
  fwrite("( ",2,1,pFVar10);
  puVar8 = p_00->pBody;
  iVar14 = puVar8[Obj] + Obj;
  if (iVar22 < iVar14) {
    puVar9 = (uint *)0x0;
    iVar11 = iVar22;
    do {
      bVar1 = p_00->pHead[iVar11];
      if (bVar1 == 4) {
        if (puVar9 == (uint *)0x0) {
          puVar9 = puVar8 + iVar11;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_00366c39;
        if (puVar9 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar11];
      }
      iVar11 = iVar11 + uVar6;
    } while (iVar11 < iVar14);
  }
  else {
    puVar9 = (uint *)0x0;
  }
  lVar23 = -1;
  if (iVar22 < iVar14) {
    do {
      bVar1 = p_00->pHead[iVar22];
      if (bVar1 == 5) {
        lVar23 = (long)(int)puVar8[iVar22];
        break;
      }
      if (bVar1 == 0) goto LAB_00366c39;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar22];
      }
      iVar22 = iVar22 + uVar6;
    } while (iVar22 < iVar14);
  }
  fprintf(pFVar10,".mem_out(%s), ",*(undefined8 *)((long)__ptr + lVar23 * 8));
  fprintf(pFVar10,".mem_in(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar9 * 8));
  fprintf(pFVar10,".addr(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar9[1] * 8));
  uVar13 = *(undefined8 *)((long)__ptr + (long)(int)puVar9[2] * 8);
  pcVar7 = ".data(%s) ";
  goto LAB_003669af;
  while( true ) {
    if (bVar1 == 0) goto LAB_00366c39;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar8[iVar17];
    }
    iVar17 = iVar17 + uVar6;
    if (iVar14 <= iVar17) break;
LAB_0036603d:
    bVar1 = p_00->pHead[iVar17];
    if (bVar1 == 7) {
      lVar23 = (long)(int)puVar8[iVar17];
      goto LAB_0036659a;
    }
  }
  lVar23 = -1;
LAB_0036659a:
  fprintf(pFVar10,"%s ",*(undefined8 *)((long)__ptr + lVar23 * 8));
LAB_003665b0:
  fwrite("( ",2,1,pFVar10);
  puVar8 = p_00->pBody;
  iVar14 = puVar8[Obj] + Obj;
  if (iVar22 < iVar14) {
    puVar9 = (uint *)0x0;
    iVar11 = iVar22;
    do {
      bVar1 = p_00->pHead[iVar11];
      if (bVar1 == 4) {
        if (puVar9 == (uint *)0x0) {
          puVar9 = puVar8 + iVar11;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_00366c39;
        if (puVar9 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar11];
      }
      iVar11 = iVar11 + uVar6;
    } while (iVar11 < iVar14);
  }
  else {
    puVar9 = (uint *)0x0;
  }
  lVar23 = -1;
  if (iVar22 < iVar14) {
    do {
      bVar1 = p_00->pHead[iVar22];
      if (bVar1 == 5) {
        lVar23 = (long)(int)puVar8[iVar22];
        break;
      }
      if (bVar1 == 0) goto LAB_00366c39;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar8[iVar22];
      }
      iVar22 = iVar22 + uVar6;
    } while (iVar22 < iVar14);
  }
  fprintf(pFVar10,".data(%s), ",*(undefined8 *)((long)__ptr + lVar23 * 8));
  fprintf(pFVar10,".mem_in(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar9 * 8));
  uVar13 = *(undefined8 *)((long)__ptr + (long)(int)puVar9[1] * 8);
  pcVar7 = ".addr(%s) ";
LAB_003669af:
  fprintf(pFVar10,pcVar7,uVar13);
  sVar18 = 3;
  pcVar7 = ");\n";
LAB_003669c7:
  fwrite(pcVar7,sVar18,1,pFVar10);
LAB_003669d4:
  if (p_00->pHead[Obj] == 0) goto LAB_00366c39;
  uVar6 = 1;
  if (p_00->pHead[Obj] < 4) {
    uVar6 = p_00->pBody[Obj];
  }
  Obj = Obj + uVar6;
  puVar8 = p_00->pBody;
  if ((int)(puVar8[iVar12] + iVar12) <= Obj) goto LAB_00366b2c;
  goto LAB_00365a70;
}

Assistant:

void Wlc_NtkToNdrTest( Wlc_Ntk_t * pNtk )
{
    // transform
    void * pDesign = Wlc_NtkToNdr( pNtk );

    // collect names     
    Wlc_Obj_t * pObj;  int i;
    char ** ppNames = ABC_ALLOC( char *, Wlc_NtkObjNum(pNtk) + 1 );
    Wlc_NtkForEachObj( pNtk, pObj, i ) 
        ppNames[i] = Wlc_ObjName(pNtk, i);

    // verify by writing Verilog
    Ndr_WriteVerilog( NULL, pDesign, ppNames );
    Ndr_Write( "test.ndr", pDesign );

    // cleanup
    Ndr_Delete( pDesign );
    ABC_FREE( ppNames );
}